

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

pair<bool,_unsigned_long> __thiscall
FloatTokenizerRule::handleFraction(FloatTokenizerRule *this,shared_ptr<Readable> *reader,size_t i)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined8 extraout_RAX;
  pair<bool,_unsigned_long> pVar4;
  pair<bool,_unsigned_long> pVar5;
  bool local_41;
  int local_40;
  bool local_39;
  pair<bool,_int> local_38;
  size_t local_30;
  size_t i_local;
  shared_ptr<Readable> *reader_local;
  FloatTokenizerRule *this_local;
  unsigned_long local_10;
  
  local_30 = i;
  i_local = (size_t)reader;
  reader_local = (shared_ptr<Readable> *)this;
  peVar3 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      reader);
  iVar2 = (*peVar3->_vptr_Readable[2])(peVar3,local_30);
  if ((char)iVar2 == '.') {
    do {
      local_30 = local_30 + 1;
      peVar3 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )i_local);
      iVar2 = (*peVar3->_vptr_Readable[2])(peVar3,local_30);
      bVar1 = isNumeric((char)iVar2);
    } while (bVar1);
    local_41 = true;
    pVar4 = std::make_pair<bool,unsigned_long&>(&local_41,&local_30);
    this_local._0_1_ = pVar4.first;
  }
  else {
    local_39 = false;
    local_40 = 0;
    local_38 = std::make_pair<bool,int>(&local_39,&local_40);
    std::pair<bool,_unsigned_long>::pair<bool,_int,_true>
              ((pair<bool,_unsigned_long> *)&this_local,&local_38);
    pVar4.second = local_10;
    pVar4._0_8_ = extraout_RAX;
  }
  local_10 = pVar4.second;
  pVar5._1_7_ = pVar4._1_7_;
  pVar5.first = (bool)this_local._0_1_;
  pVar5.second = local_10;
  return pVar5;
}

Assistant:

std::pair<bool, std::size_t> handleFraction(
    const std::shared_ptr<Readable>& reader,
    std::size_t i) {

    if (reader->charAt(i) != '.') {
      return std::make_pair(false, 0);
    }

    i++;

    while (isNumeric(reader->charAt(i))) {
      i++;
    }

    return std::make_pair(true, i);
  }